

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O3

void ptls_minicrypto_random_bytes(void *buf,size_t len)

{
  cf_hash_drbg_sha256 *ctx;
  uint32_t uVar1;
  uint __fd;
  ssize_t sVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  char *pcVar6;
  size_t __nbytes;
  long *in_FS_OFFSET;
  uint8_t entropy [256];
  undefined8 local_138 [16];
  undefined1 local_b8 [136];
  
  ctx = (cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74);
  uVar1 = cf_hash_drbg_sha256_needs_reseed(ctx);
  if (uVar1 != 0) {
    __fd = open("/dev/urandom",0x80000);
    if (__fd == 0xffffffff) {
      pcVar6 = "/dev/random";
      puVar5 = (undefined8 *)0x80000;
      __fd = open("/dev/random",0x80000);
      if (__fd == 0xffffffff) {
LAB_00107083:
        ptls_minicrypto_random_bytes_cold_2();
        puVar4 = (undefined8 *)malloc(0x60);
        if (puVar4 != (undefined8 *)0x0) {
          *puVar4 = pcVar6;
          puVar4[1] = puVar4 + 8;
          puVar4[2] = 0x20;
          puVar4[3] = x25519_on_exchange;
          ptls_minicrypto_random_bytes(puVar4 + 4,0x20);
          cf_curve25519_mul_base((uint8_t *)(puVar4 + 8),(uint8_t *)(puVar4 + 4));
          *puVar5 = puVar4;
        }
        return;
      }
    }
    __nbytes = 0x100;
    puVar4 = local_138;
    do {
      while( true ) {
        pcVar6 = (char *)(ulong)__fd;
        puVar5 = puVar4;
        sVar2 = read(__fd,puVar4,__nbytes);
        if (sVar2 != -1) break;
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
LAB_0010707e:
          ptls_minicrypto_random_bytes_cold_1();
          goto LAB_00107083;
        }
      }
      if (sVar2 < 0) goto LAB_0010707e;
      puVar4 = (undefined8 *)((long)puVar4 + sVar2);
      __nbytes = __nbytes - sVar2;
    } while (__nbytes != 0);
    close(__fd);
    cf_hash_drbg_sha256_init(ctx,local_138,0x80,local_b8,0x80,"ptls",4);
  }
  cf_hash_drbg_sha256_gen(ctx,buf,len);
  return;
}

Assistant:

void ptls_minicrypto_random_bytes(void *buf, size_t len)
{
#ifdef _WINDOWS
    static __declspec(thread) cf_hash_drbg_sha256 ctx;
#else
    static __thread cf_hash_drbg_sha256 ctx;
#endif

    if (cf_hash_drbg_sha256_needs_reseed(&ctx)) {
        uint8_t entropy[256];
        read_entropy(entropy, sizeof(entropy));
        cf_hash_drbg_sha256_init(&ctx, entropy, sizeof(entropy) / 2, entropy + sizeof(entropy) / 2, sizeof(entropy) / 2, "ptls", 4);
    }
    cf_hash_drbg_sha256_gen(&ctx, buf, len);
}